

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl.cpp
# Opt level: O0

void ImGui_ImplGlfwGL3_NewFrame(void)

{
  int iVar1;
  float *pfVar2;
  uchar *puVar3;
  float local_c0;
  float local_bc;
  float local_b8;
  float local_b4;
  GLFWcursor *local_b0;
  bool local_99;
  float local_98;
  float local_94;
  float local_8c;
  float local_88;
  float local_84;
  float v_3;
  float v_2;
  float v_1;
  float v;
  uchar *buttons;
  float *axes;
  int buttons_count;
  int axes_count;
  ImGuiMouseCursor cursor;
  int i;
  ImVec2 local_50;
  double local_48;
  double mouse_y;
  double mouse_x;
  double current_time;
  ImVec2 local_28;
  int local_20;
  int local_1c;
  int display_h;
  int display_w;
  int h;
  int w;
  ImGuiIO *io;
  
  if (g_FontTexture == 0) {
    ImGui_ImplGlfwGL3_CreateDeviceObjects();
  }
  _h = ImGui::GetIO();
  glfwGetWindowSize(g_Window,&display_w,&display_h);
  glfwGetFramebufferSize(g_Window,&local_1c,&local_20);
  ImVec2::ImVec2(&local_28,(float)display_w,(float)display_h);
  _h->DisplaySize = local_28;
  if (display_w < 1) {
    local_8c = 0.0;
  }
  else {
    local_8c = (float)local_1c / (float)display_w;
  }
  if (display_h < 1) {
    local_94 = 0.0;
  }
  else {
    local_94 = (float)local_20 / (float)display_h;
  }
  ImVec2::ImVec2((ImVec2 *)&current_time,local_8c,local_94);
  _h->DisplayFramebufferScale = (ImVec2)current_time;
  mouse_x = glfwGetTime();
  if (g_Time <= 0.0) {
    local_98 = 0.016666668;
  }
  else {
    local_98 = (float)(mouse_x - g_Time);
  }
  _h->DeltaTime = local_98;
  g_Time = mouse_x;
  iVar1 = glfwGetWindowAttrib(g_Window,0x20001);
  if (iVar1 == 0) {
    ImVec2::ImVec2((ImVec2 *)&cursor,-3.4028235e+38,-3.4028235e+38);
    _h->MousePos = _cursor;
  }
  else if ((_h->WantSetMousePos & 1U) == 0) {
    glfwGetCursorPos(g_Window,&mouse_y,&local_48);
    ImVec2::ImVec2(&local_50,(float)mouse_y,(float)local_48);
    _h->MousePos = local_50;
  }
  else {
    glfwSetCursorPos(g_Window,(double)(_h->MousePos).x,(double)(_h->MousePos).y);
  }
  for (axes_count = 0; axes_count < 3; axes_count = axes_count + 1) {
    local_99 = true;
    if ((g_MouseJustPressed[axes_count] & 1U) == 0) {
      iVar1 = glfwGetMouseButton(g_Window,axes_count);
      local_99 = iVar1 != 0;
    }
    _h->MouseDown[axes_count] = local_99;
    g_MouseJustPressed[axes_count] = false;
  }
  if (((_h->ConfigFlags & 0x20U) == 0) &&
     (iVar1 = glfwGetInputMode(g_Window,0x33001), iVar1 != 0x34003)) {
    buttons_count = ImGui::GetMouseCursor();
    if (((_h->MouseDrawCursor & 1U) == 0) && (buttons_count != -1)) {
      if (g_MouseCursors[buttons_count] == (GLFWcursor *)0x0) {
        local_b0 = g_MouseCursors[0];
      }
      else {
        local_b0 = g_MouseCursors[buttons_count];
      }
      glfwSetCursor(g_Window,local_b0);
      glfwSetInputMode(g_Window,0x33001,0x34001);
    }
    else {
      glfwSetInputMode(g_Window,0x33001,0x34002);
    }
  }
  memset(_h->NavInputs,0,0x54);
  if ((_h->ConfigFlags & 2U) != 0) {
    axes._4_4_ = 0;
    axes._0_4_ = 0;
    pfVar2 = glfwGetJoystickAxes(0,(int *)((long)&axes + 4));
    puVar3 = glfwGetJoystickButtons(0,(int *)&axes);
    if ((0 < (int)axes) && (*puVar3 == '\x01')) {
      _h->NavInputs[0] = 1.0;
    }
    if ((1 < (int)axes) && (puVar3[1] == '\x01')) {
      _h->NavInputs[1] = 1.0;
    }
    if ((2 < (int)axes) && (puVar3[2] == '\x01')) {
      _h->NavInputs[3] = 1.0;
    }
    if ((3 < (int)axes) && (puVar3[3] == '\x01')) {
      _h->NavInputs[2] = 1.0;
    }
    if ((0xd < (int)axes) && (puVar3[0xd] == '\x01')) {
      _h->NavInputs[4] = 1.0;
    }
    if ((0xb < (int)axes) && (puVar3[0xb] == '\x01')) {
      _h->NavInputs[5] = 1.0;
    }
    if ((10 < (int)axes) && (puVar3[10] == '\x01')) {
      _h->NavInputs[6] = 1.0;
    }
    if ((0xc < (int)axes) && (puVar3[0xc] == '\x01')) {
      _h->NavInputs[7] = 1.0;
    }
    if ((4 < (int)axes) && (puVar3[4] == '\x01')) {
      _h->NavInputs[0xc] = 1.0;
    }
    if ((5 < (int)axes) && (puVar3[5] == '\x01')) {
      _h->NavInputs[0xd] = 1.0;
    }
    if ((4 < (int)axes) && (puVar3[4] == '\x01')) {
      _h->NavInputs[0xe] = 1.0;
    }
    if ((5 < (int)axes) && (puVar3[5] == '\x01')) {
      _h->NavInputs[0xf] = 1.0;
    }
    if (axes._4_4_ < 1) {
      local_b4 = -0.3;
    }
    else {
      local_b4 = *pfVar2;
    }
    v_2 = (local_b4 - -0.3) / -0.59999996;
    if (1.0 < v_2) {
      v_2 = 1.0;
    }
    if (_h->NavInputs[8] < v_2) {
      _h->NavInputs[8] = v_2;
    }
    if (axes._4_4_ < 1) {
      local_b8 = 0.3;
    }
    else {
      local_b8 = *pfVar2;
    }
    v_3 = (local_b8 - 0.3) / 0.59999996;
    if (1.0 < v_3) {
      v_3 = 1.0;
    }
    if (_h->NavInputs[9] < v_3) {
      _h->NavInputs[9] = v_3;
    }
    if (axes._4_4_ < 2) {
      local_bc = 0.3;
    }
    else {
      local_bc = pfVar2[1];
    }
    local_84 = (local_bc - 0.3) / 0.59999996;
    if (1.0 < local_84) {
      local_84 = 1.0;
    }
    if (_h->NavInputs[10] < local_84) {
      _h->NavInputs[10] = local_84;
    }
    if (axes._4_4_ < 2) {
      local_c0 = -0.3;
    }
    else {
      local_c0 = pfVar2[1];
    }
    local_88 = (local_c0 - -0.3) / -0.59999996;
    if (1.0 < local_88) {
      local_88 = 1.0;
    }
    if (_h->NavInputs[0xb] < local_88) {
      _h->NavInputs[0xb] = local_88;
    }
    if ((axes._4_4_ < 1) || ((int)axes < 1)) {
      _h->BackendFlags = _h->BackendFlags & 0xfffffffe;
    }
    else {
      _h->BackendFlags = _h->BackendFlags | 1;
    }
  }
  ImGui::NewFrame();
  return;
}

Assistant:

void ImGui_ImplGlfwGL3_NewFrame()
{
    if (!g_FontTexture)
        ImGui_ImplGlfwGL3_CreateDeviceObjects();

    ImGuiIO& io = ImGui::GetIO();

    // Setup display size (every frame to accommodate for window resizing)
    int w, h;
    int display_w, display_h;
    glfwGetWindowSize(g_Window, &w, &h);
    glfwGetFramebufferSize(g_Window, &display_w, &display_h);
    io.DisplaySize = ImVec2((float)w, (float)h);
    io.DisplayFramebufferScale = ImVec2(w > 0 ? ((float)display_w / w) : 0, h > 0 ? ((float)display_h / h) : 0);

    // Setup time step
    double current_time =  glfwGetTime();
    io.DeltaTime = g_Time > 0.0 ? (float)(current_time - g_Time) : (float)(1.0f/60.0f);
    g_Time = current_time;

    // Setup inputs
    // (we already got mouse wheel, keyboard keys & characters from glfw callbacks polled in glfwPollEvents())
    if (glfwGetWindowAttrib(g_Window, GLFW_FOCUSED))
    {
        // Set OS mouse position if requested (only used when ImGuiConfigFlags_NavEnableSetMousePos is enabled by user)
        if (io.WantSetMousePos)
        {
            glfwSetCursorPos(g_Window, (double)io.MousePos.x, (double)io.MousePos.y);
        }
        else
        {
            double mouse_x, mouse_y;
            glfwGetCursorPos(g_Window, &mouse_x, &mouse_y);
            io.MousePos = ImVec2((float)mouse_x, (float)mouse_y);
        }
    }
    else
    {
        io.MousePos = ImVec2(-FLT_MAX,-FLT_MAX);
    }

    for (int i = 0; i < 3; i++)
    {
        // If a mouse press event came, always pass it as "mouse held this frame", so we don't miss click-release events that are shorter than 1 frame.
        io.MouseDown[i] = g_MouseJustPressed[i] || glfwGetMouseButton(g_Window, i) != 0;
        g_MouseJustPressed[i] = false;
    }

    // Update OS/hardware mouse cursor if imgui isn't drawing a software cursor
    if ((io.ConfigFlags & ImGuiConfigFlags_NoMouseCursorChange) == 0 && glfwGetInputMode(g_Window, GLFW_CURSOR) != GLFW_CURSOR_DISABLED)
    {
        ImGuiMouseCursor cursor = ImGui::GetMouseCursor();
        if (io.MouseDrawCursor || cursor == ImGuiMouseCursor_None)
        {
            glfwSetInputMode(g_Window, GLFW_CURSOR, GLFW_CURSOR_HIDDEN);
        }
        else
        {
            glfwSetCursor(g_Window, g_MouseCursors[cursor] ? g_MouseCursors[cursor] : g_MouseCursors[ImGuiMouseCursor_Arrow]);
            glfwSetInputMode(g_Window, GLFW_CURSOR, GLFW_CURSOR_NORMAL);
        }
    }

    // Gamepad navigation mapping [BETA]
    memset(io.NavInputs, 0, sizeof(io.NavInputs));
    if (io.ConfigFlags & ImGuiConfigFlags_NavEnableGamepad)
    {
        // Update gamepad inputs
        #define MAP_BUTTON(NAV_NO, BUTTON_NO)       { if (buttons_count > BUTTON_NO && buttons[BUTTON_NO] == GLFW_PRESS) io.NavInputs[NAV_NO] = 1.0f; }
        #define MAP_ANALOG(NAV_NO, AXIS_NO, V0, V1) { float v = (axes_count > AXIS_NO) ? axes[AXIS_NO] : V0; v = (v - V0) / (V1 - V0); if (v > 1.0f) v = 1.0f; if (io.NavInputs[NAV_NO] < v) io.NavInputs[NAV_NO] = v; }
        int axes_count = 0, buttons_count = 0;
        const float* axes = glfwGetJoystickAxes(GLFW_JOYSTICK_1, &axes_count);
        const unsigned char* buttons = glfwGetJoystickButtons(GLFW_JOYSTICK_1, &buttons_count);
        MAP_BUTTON(ImGuiNavInput_Activate,   0);     // Cross / A
        MAP_BUTTON(ImGuiNavInput_Cancel,     1);     // Circle / B
        MAP_BUTTON(ImGuiNavInput_Menu,       2);     // Square / X
        MAP_BUTTON(ImGuiNavInput_Input,      3);     // Triangle / Y
        MAP_BUTTON(ImGuiNavInput_DpadLeft,   13);    // D-Pad Left
        MAP_BUTTON(ImGuiNavInput_DpadRight,  11);    // D-Pad Right
        MAP_BUTTON(ImGuiNavInput_DpadUp,     10);    // D-Pad Up
        MAP_BUTTON(ImGuiNavInput_DpadDown,   12);    // D-Pad Down
        MAP_BUTTON(ImGuiNavInput_FocusPrev,  4);     // L1 / LB
        MAP_BUTTON(ImGuiNavInput_FocusNext,  5);     // R1 / RB
        MAP_BUTTON(ImGuiNavInput_TweakSlow,  4);     // L1 / LB
        MAP_BUTTON(ImGuiNavInput_TweakFast,  5);     // R1 / RB
        MAP_ANALOG(ImGuiNavInput_LStickLeft, 0,  -0.3f,  -0.9f);
        MAP_ANALOG(ImGuiNavInput_LStickRight,0,  +0.3f,  +0.9f);
        MAP_ANALOG(ImGuiNavInput_LStickUp,   1,  +0.3f,  +0.9f);
        MAP_ANALOG(ImGuiNavInput_LStickDown, 1,  -0.3f,  -0.9f);
        #undef MAP_BUTTON
        #undef MAP_ANALOG
        if (axes_count > 0 && buttons_count > 0) 
            io.BackendFlags |= ImGuiBackendFlags_HasGamepad; 
        else 
            io.BackendFlags &= ~ImGuiBackendFlags_HasGamepad;
    }

    // Start the frame. This call will update the io.WantCaptureMouse, io.WantCaptureKeyboard flag that you can use to dispatch inputs (or not) to your application.
    ImGui::NewFrame();
}